

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O0

size_t light_get_size(light_pcapng pcapng)

{
  size_t size;
  light_pcapng iterator;
  light_pcapng pcapng_local;
  
  size = 0;
  for (iterator = pcapng; iterator != (light_pcapng)0x0; iterator = iterator->next_block) {
    size = iterator->block_total_lenght + size;
  }
  return size;
}

Assistant:

size_t light_get_size(const light_pcapng pcapng)
{
	light_pcapng iterator = pcapng;
	size_t size = 0;

	while (iterator != NULL) {
		size += iterator->block_total_lenght;
		iterator = iterator->next_block;
	}

	return size;
}